

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_bytedata160.cpp
# Opt level: O0

void __thiscall ByteData160_Join_Test::~ByteData160_Join_Test(ByteData160_Join_Test *this)

{
  ByteData160_Join_Test *this_local;
  
  ~ByteData160_Join_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST(ByteData160, Join) {
  ByteData160 base("1111111111111111111111111111111111111111");
  ByteData data1("2233");
  ByteData160 data2("4444444444444444444444444444444444444444");
  ByteData256 data3("5555555555555555555555555555555555555555555555555555555555555555");
  ByteData result;

  EXPECT_NO_THROW(result = base.Join(data1, data2, data3));
  EXPECT_STREQ(result.GetHex().c_str(), "1111111111111111111111111111111111111111223344444444444444444444444444444444444444445555555555555555555555555555555555555555555555555555555555555555");
}